

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O0

void __thiscall re2c::dfa_t::~dfa_t(dfa_t *this)

{
  dfa_state_t *this_00;
  bool bVar1;
  reference ppdVar2;
  __normal_iterator<re2c::dfa_state_t_**,_std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>_>
  local_20;
  iterator e;
  iterator i;
  dfa_t *this_local;
  
  e = std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::begin(&this->states);
  local_20._M_current =
       (dfa_state_t **)
       std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::end(&this->states);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&e,&local_20);
    if (!bVar1) break;
    ppdVar2 = __gnu_cxx::
              __normal_iterator<re2c::dfa_state_t_**,_std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>_>
              ::operator*(&e);
    this_00 = *ppdVar2;
    if (this_00 != (dfa_state_t *)0x0) {
      dfa_state_t::~dfa_state_t(this_00);
      operator_delete(this_00,0x18);
    }
    __gnu_cxx::
    __normal_iterator<re2c::dfa_state_t_**,_std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>_>
    ::operator++(&e);
  }
  std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::~vector(&this->states);
  return;
}

Assistant:

dfa_t::~dfa_t()
{
	std::vector<dfa_state_t*>::iterator
		i = states.begin(),
		e = states.end();
	for (; i != e; ++i)
	{
		delete *i;
	}
}